

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O0

ActionResults * __thiscall BlueRoomFourAction::Use(BlueRoomFourAction *this)

{
  itemType iVar1;
  ItemWrapper *pIVar2;
  string local_78 [32];
  undefined4 local_58;
  itemType local_54 [7];
  string local_38 [8];
  string information;
  BlueRoomFourAction *this_local;
  
  std::__cxx11::string::string(local_38);
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == ROPE) {
    iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == WHITE_PILLAR) {
      if ((this->blackPillarRope & 1U) == 0) {
        this->whitePillarRope = true;
        std::__cxx11::string::operator=(local_38,"You tie the rope to the hook on the white pillar")
        ;
      }
      else {
        this->whitePillarRope = true;
        local_54[3] = 0x23;
        pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_54 + 3);
        ItemWrapper::setLocation(pIVar2,HIDDEN);
        local_54[2] = 0x1c;
        pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_54 + 2);
        ItemWrapper::setLocation(pIVar2,WON);
        std::__cxx11::string::operator=
                  (local_38,
                   "You tie the other end of the rope to the other pillar. Suddenly the rope sinks into the ground, pulling the pillars to the center. The walls have shifted and reveal a door to the north."
                  );
      }
    }
    else {
      iVar1 = Command::getActedOnItem((this->super_AbstractRoomAction).commands);
      if (iVar1 == BLACK_PILLAR) {
        if ((this->whitePillarRope & 1U) == 0) {
          this->blackPillarRope = true;
          std::__cxx11::string::operator=(local_38,"You tie the rope to hook on the black pillar");
        }
        else {
          this->blackPillarRope = true;
          local_54[1] = 0x23;
          pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_54 + 1);
          ItemWrapper::setLocation(pIVar2,HIDDEN);
          local_54[0] = BALL;
          pIVar2 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,local_54);
          ItemWrapper::setLocation(pIVar2,WON);
          std::__cxx11::string::operator=
                    (local_38,
                     "You tie the other end of the rope to the other pillar. Suddenly the rope sinks into the ground, pulling the pillars to the center. The walls have shifted and reveal a door to the north."
                    );
        }
      }
      else {
        std::__cxx11::string::operator=(local_38,"You can\'t use the rope on that.");
      }
    }
    this_local = (BlueRoomFourAction *)operator_new(0x30);
    std::__cxx11::string::string(local_78,local_38);
    ActionResults::ActionResults((ActionResults *)this_local,CURRENT,(string *)local_78);
    std::__cxx11::string::~string(local_78);
  }
  else {
    this_local = (BlueRoomFourAction *)AbstractRoomAction::Use(&this->super_AbstractRoomAction);
  }
  local_58 = 1;
  std::__cxx11::string::~string(local_38);
  return (ActionResults *)this_local;
}

Assistant:

ActionResults * BlueRoomFourAction::Use() {
    std::string information;
    switch(commands->getMainItem()) {
        case ROPE :
            if (commands->getActedOnItem() == WHITE_PILLAR) {
                if(blackPillarRope){
                    whitePillarRope = true;
                    itemList->getValue(ROPE)->setLocation(HIDDEN);
                    itemList->getValue(BALL)->setLocation(WON);
                    information = "You tie the other end of the rope to the other pillar. "
                    "Suddenly the rope sinks into the ground, pulling the pillars to the center. "
                    "The walls have shifted and reveal a door to the north.";
                    break;
                }

                whitePillarRope = true;
                information = "You tie the rope to the hook on the white pillar";
            } else if (commands->getActedOnItem() == BLACK_PILLAR) {
                if(whitePillarRope){
                    blackPillarRope = true;
                    itemList->getValue(ROPE)->setLocation(HIDDEN);
                    itemList->getValue(BALL)->setLocation(WON);
                    information = "You tie the other end of the rope to the other pillar. "
                            "Suddenly the rope sinks into the ground, pulling the pillars to the center. "
                            "The walls have shifted and reveal a door to the north.";
                    break;
                }
                blackPillarRope = true;
                information = "You tie the rope to hook on the black pillar";
            } else {
                information= "You can't use the rope on that.";
            }
            break;
        default:
            return AbstractRoomAction::Use();
    }
    return new ActionResults(CURRENT, information);
}